

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_29e96d::ArgParser::argEncPositional(ArgParser *this,string *arg)

{
  size_type sVar1;
  reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 local_70 [8];
  value_type len_str;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *arg_local;
  ArgParser *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  if ((this->used_enc_password_args & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"positional and dashed encryption arguments may not be mixed",
               &local_39);
    usage(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->accumulated_args,local_18);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->accumulated_args);
  if (2 < sVar1) {
    this_00 = &this->accumulated_args;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(this_00,0);
    std::__cxx11::string::operator=((string *)&this->user_password,(string *)pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(this_00,1);
    std::__cxx11::string::operator=((string *)&this->owner_password,(string *)pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(this_00,2);
    std::__cxx11::string::string((string *)local_70,(string *)pvVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    argEncBits(this,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void
ArgParser::argEncPositional(std::string const& arg)
{
    if (used_enc_password_args) {
        usage("positional and dashed encryption arguments may not be mixed");
    }

    this->accumulated_args.push_back(arg);
    if (this->accumulated_args.size() < 3) {
        return;
    }
    user_password = this->accumulated_args.at(0);
    owner_password = this->accumulated_args.at(1);
    auto len_str = this->accumulated_args.at(2);
    this->accumulated_args.clear();
    argEncBits(len_str);
}